

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double __x;
  double dVar1;
  uint uVar2;
  char *pcVar3;
  double *pdVar4;
  long lVar5;
  pointer pvVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  ostream *poVar12;
  double *pdVar13;
  int write_size;
  char *pcVar14;
  int iVar15;
  pointer pdVar16;
  pointer pvVar17;
  ostringstream *input_stream;
  ulong uVar18;
  double dVar19;
  int fft_length;
  int frame_shift;
  allocator local_459;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  Algorithms local_430;
  int local_42c;
  vector<double,_std::allocator<double>_> f0;
  double upper_bound;
  double lower_bound;
  double sampling_rate;
  AperiodicityExtraction aperiodicity_extraction;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> waveform;
  double tmp_3;
  ostringstream error_message;
  uint auStack_218 [122];
  
  fft_length = 0x100;
  frame_shift = 0x50;
  sampling_rate = 16.0;
  lower_bound = 0.001;
  upper_bound = 0.999;
  local_42c = 0;
  local_430 = kTandem;
  iVar15 = 0;
LAB_001036cb:
  iVar10 = ya_getopt_long(argc,argv,"a:l:p:s:L:H:q:o:h",(option *)0x0,(int *)0x0);
  switch(iVar10) {
  case 0x68:
    anon_unknown.dwarf_3d72::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x72:
switchD_001036f4_caseD_69:
    anon_unknown.dwarf_3d72::PrintUsage((ostream *)&std::cerr);
    return 1;
  case 0x6c:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar8 = sptk::ConvertStringToInteger((string *)&error_message,&fft_length);
    bVar7 = fft_length < 1;
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar8 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "The argument for the -l option must be a positive integer");
      std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
      sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
      goto LAB_0010401d;
    }
    goto LAB_001036cb;
  case 0x6f:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar7 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&aperiodicity);
    if (bVar7) {
      bVar7 = sptk::IsInRange((Algorithms)
                              aperiodicity.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,0,3);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar7) {
        iVar15 = (Algorithms)
                 aperiodicity.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_001036cb;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar12 = std::operator<<((ostream *)&error_message,
                              "The argument for the -o option must be an integer ");
    poVar12 = std::operator<<(poVar12,"in the range of ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0);
    poVar12 = std::operator<<(poVar12," to ");
    std::ostream::operator<<((ostream *)poVar12,3);
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&f0);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  case 0x70:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar8 = sptk::ConvertStringToInteger((string *)&error_message,&frame_shift);
    bVar7 = frame_shift < 1;
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar8 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "The argument for the -p option must be a positive integer");
      std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
      sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
      goto LAB_0010401d;
    }
    goto LAB_001036cb;
  case 0x71:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar7 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&aperiodicity);
    if (bVar7) {
      bVar7 = sptk::IsInRange((Algorithms)
                              aperiodicity.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,0,2);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar7) {
        local_42c = (Algorithms)
                    aperiodicity.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_001036cb;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar12 = std::operator<<((ostream *)&error_message,
                              "The argument for the -q option must be an integer ");
    poVar12 = std::operator<<(poVar12,"in the range of ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0);
    poVar12 = std::operator<<(poVar12," to ");
    std::ostream::operator<<((ostream *)poVar12,2);
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&f0);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  case 0x73:
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar7 = sptk::ConvertStringToDouble((string *)&error_message,&sampling_rate);
    if (bVar7) {
      bVar7 = sptk::IsInRange(sampling_rate,8.0,98.0);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar7) goto LAB_001036cb;
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar12 = std::operator<<((ostream *)&error_message,
                              "The argument for the -s option must be in a number ");
    std::operator<<(poVar12,"in the interval [");
    poVar12 = std::ostream::_M_insert<double>(8.0);
    std::operator<<(poVar12,", ");
    poVar12 = std::ostream::_M_insert<double>(98.0);
    std::operator<<(poVar12,"]");
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  }
  if (iVar10 == 0x48) {
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar7 = sptk::ConvertStringToDouble((string *)&error_message,&upper_bound);
    if (!bVar7) {
      std::__cxx11::string::~string((string *)&error_message);
      goto LAB_00103cdf;
    }
    bVar7 = sptk::IsInRange(upper_bound,0.0,1.0);
    std::__cxx11::string::~string((string *)&error_message);
    if (!bVar7) {
LAB_00103cdf:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "The argument for the -H option must be in [0.0, 1.0]");
      std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
      sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
LAB_0010401d:
      std::__cxx11::string::~string((string *)&tmp_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      return 1;
    }
    goto LAB_001036cb;
  }
  if (iVar10 == 0x4c) {
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar7 = sptk::ConvertStringToDouble((string *)&error_message,&lower_bound);
    if (bVar7) {
      bVar7 = sptk::IsInRange(lower_bound,0.0,1.0);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar7) goto LAB_001036cb;
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"The argument for the -L option must be in [0.0, 1.0]"
                   );
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  }
  if (iVar10 == 0x61) {
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&tmp_3);
    bVar7 = sptk::ConvertStringToInteger((string *)&error_message,(int *)&aperiodicity);
    if (bVar7) {
      bVar7 = sptk::IsInRange((Algorithms)
                              aperiodicity.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,0,1);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar7) {
        local_430 = (Algorithms)
                    aperiodicity.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_001036cb;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&error_message);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    poVar12 = std::operator<<((ostream *)&error_message,
                              "The argument for the -a option must be an integer ");
    poVar12 = std::operator<<(poVar12,"in the range of ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0);
    poVar12 = std::operator<<(poVar12," to ");
    std::ostream::operator<<((ostream *)poVar12,1);
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&f0);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  }
  if (iVar10 != -1) goto switchD_001036f4_caseD_69;
  if (upper_bound <= lower_bound) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Lower bound must be less than upper one");
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  }
  lVar11 = (long)argc;
  if (argc - ya_optind == 1) {
    lVar5 = lVar11 + -1;
    pcVar14 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "Just two input files, f0file and infile, are required");
      std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
      sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
      goto LAB_0010401d;
    }
    lVar5 = lVar11 + -2;
    pcVar14 = argv[lVar11 + -1];
  }
  pcVar3 = argv[lVar5];
  bVar7 = sptk::SetBinaryMode();
  dVar1 = sampling_rate;
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
    sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
    goto LAB_0010401d;
  }
  f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&error_message);
  std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar3);
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(_error_message + -0x18));
  if ((uVar2 & 5) == 0) {
    while (bVar7 = sptk::ReadStream<double>(&tmp_3,(istream *)&error_message),
          pdVar16 = f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish, bVar7) {
      std::vector<double,_std::allocator<double>_>::push_back(&f0,&tmp_3);
    }
    pdVar13 = f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (local_42c == 2) {
      for (; pdVar13 != pdVar16; pdVar13 = pdVar13 + 1) {
        __x = *pdVar13;
        dVar19 = 150.0;
        if ((__x != -10000000000.0) || (NAN(__x))) {
          dVar19 = exp(__x);
        }
        *pdVar13 = dVar19;
      }
    }
    else if (local_42c == 1) {
      for (; pdVar13 !=
             f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish; pdVar13 = pdVar13 + 1) {
        uVar18 = -(ulong)(*pdVar13 == 0.0);
        *pdVar13 = (double)(~uVar18 & (ulong)*pdVar13 | uVar18 & 0x4062c00000000000);
      }
    }
    else if (local_42c == 0) {
      for (; pdVar13 !=
             f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish; pdVar13 = pdVar13 + 1) {
        uVar18 = -(ulong)(*pdVar13 == 0.0);
        *pdVar13 = (double)(uVar18 & 0x4062c00000000000 |
                           ~uVar18 & (ulong)((dVar1 * 1000.0) / *pdVar13));
      }
    }
    iVar10 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_3);
    poVar12 = std::operator<<((ostream *)&tmp_3,"Cannot open file ");
    std::operator<<(poVar12,pcVar3);
    std::__cxx11::string::string((string *)&aperiodicity,"ap",(allocator *)&waveform);
    sptk::PrintErrorMessage((string *)&aperiodicity,(ostringstream *)&tmp_3);
    std::__cxx11::string::~string((string *)&aperiodicity);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_3);
    iVar10 = 1;
  }
  std::ifstream::~ifstream(&error_message);
  if ((uVar2 & 5) == 0) {
    if (f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      iVar10 = 0;
    }
    else {
      waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      input_stream = &error_message;
      std::ifstream::ifstream(input_stream);
      if ((pcVar14 == (char *)0x0) ||
         (std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar14),
         (*(byte *)((long)auStack_218 + *(long *)(_error_message + -0x18)) & 5) == 0)) {
        cVar9 = std::__basic_file<char>::is_open();
        if (cVar9 == '\0') {
          input_stream = (ostringstream *)&std::cin;
        }
        while (bVar7 = sptk::ReadStream<double>(&tmp_3,(istream *)input_stream), bVar7) {
          std::vector<double,_std::allocator<double>_>::push_back(&waveform,&tmp_3);
        }
        bVar7 = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_3);
        poVar12 = std::operator<<((ostream *)&tmp_3,"Cannot open file ");
        std::operator<<(poVar12,pcVar14);
        std::__cxx11::string::string((string *)&aperiodicity,"ap",(allocator *)&output);
        sptk::PrintErrorMessage((string *)&aperiodicity,(ostringstream *)&tmp_3);
        std::__cxx11::string::~string((string *)&aperiodicity);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_3);
        iVar10 = 1;
        bVar7 = false;
      }
      std::ifstream::~ifstream(&error_message);
      if (bVar7) {
        if (waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar10 = 0;
        }
        else {
          sptk::AperiodicityExtraction::AperiodicityExtraction
                    (&aperiodicity_extraction,fft_length,frame_shift,dVar1 * 1000.0,local_430);
          if ((aperiodicity_extraction.aperiodicity_extraction_ ==
               (AperiodicityExtractionInterface *)0x0) ||
             (iVar10 = (*(aperiodicity_extraction.aperiodicity_extraction_)->
                         _vptr_AperiodicityExtractionInterface[3])(), (char)iVar10 == '\0')) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Failed to initialize AperiodicityExtraction")
            ;
            std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&aperiodicity);
            sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
            std::__cxx11::string::~string((string *)&tmp_3);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
            iVar10 = 1;
          }
          else {
            aperiodicity.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            aperiodicity.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            aperiodicity.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar7 = sptk::AperiodicityExtraction::Run
                              (&aperiodicity_extraction,&waveform,&f0,&aperiodicity);
            if (bVar7) {
              write_size = fft_length / 2 + 1;
              std::vector<double,_std::allocator<double>_>::vector
                        (&output,(long)write_size,(allocator_type *)&error_message);
              pvVar6 = aperiodicity.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              iVar10 = 0;
              pvVar17 = aperiodicity.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (pvVar17 == pvVar6) goto LAB_0010450a;
                pdVar4 = (pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                pdVar16 = output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                for (pdVar13 = (pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start; pdVar13 != pdVar4;
                    pdVar13 = pdVar13 + 1) {
                  dVar1 = *pdVar13;
                  if (*pdVar13 <= lower_bound) {
                    dVar1 = lower_bound;
                  }
                  if (upper_bound <= dVar1) {
                    dVar1 = upper_bound;
                  }
                  *pdVar16 = dVar1;
                  pdVar16 = pdVar16 + 1;
                }
                pdVar13 = output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (iVar15 == 1) {
                  for (; pdVar13 !=
                         output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                    *pdVar13 = 1.0 - *pdVar13;
                  }
                }
                else if (iVar15 == 2) {
                  for (; pdVar13 !=
                         output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                    *pdVar13 = *pdVar13 / (1.0 - *pdVar13);
                  }
                }
                else if (iVar15 == 3) {
                  for (; pdVar13 !=
                         output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                    *pdVar13 = (1.0 - *pdVar13) / *pdVar13;
                  }
                }
                bVar7 = sptk::WriteStream<double>
                                  (0,write_size,&output,(ostream *)&std::cout,(int *)0x0);
                pvVar17 = pvVar17 + 1;
              } while (bVar7);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
              std::operator<<((ostream *)&error_message,"Failed to write aperiodicity");
              std::__cxx11::string::string((string *)&tmp_3,"ap",&local_459);
              sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
              std::__cxx11::string::~string((string *)&tmp_3);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
              iVar10 = 1;
LAB_0010450a:
              std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                        (&output.super__Vector_base<double,_std::allocator<double>_>);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
              std::operator<<((ostream *)&error_message,"Failed to extract aperiodicity");
              std::__cxx11::string::string((string *)&tmp_3,"ap",(allocator *)&output);
              sptk::PrintErrorMessage((string *)&tmp_3,&error_message);
              std::__cxx11::string::~string((string *)&tmp_3);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
              iVar10 = 1;
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&aperiodicity);
          }
          aperiodicity_extraction._vptr_AperiodicityExtraction =
               (_func_int **)&PTR__AperiodicityExtraction_0011dc20;
          if (aperiodicity_extraction.aperiodicity_extraction_ !=
              (AperiodicityExtractionInterface *)0x0) {
            (*(aperiodicity_extraction.aperiodicity_extraction_)->
              _vptr_AperiodicityExtractionInterface[1])();
          }
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&waveform.super__Vector_base<double,_std::allocator<double>_>);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&f0.super__Vector_base<double,_std::allocator<double>_>);
  return iVar10;
}

Assistant:

int main(int argc, char* argv[]) {
  sptk::AperiodicityExtraction::Algorithms algorithm(kDefaultAlgorithm);
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "a:l:p:s:L:H:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'a': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::AperiodicityExtraction::Algorithms::kNumAlgorithms) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        algorithm = static_cast<sptk::AperiodicityExtraction::Algorithms>(tmp);
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound) ||
            !sptk::IsInRange(lower_bound, 0.0, 1.0)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be in [0.0, 1.0]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound) ||
            !sptk::IsInRange(upper_bound, 0.0, 1.0)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be in [0.0, 1.0]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Lower bound must be less than upper one";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  const char* f0_file;
  const char* raw_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    f0_file = argv[argc - 2];
    raw_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    f0_file = argv[argc - 1];
    raw_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, f0file and infile, are required";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    ifs.open(f0_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << f0_file;
      sptk::PrintErrorMessage("ap", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (input_format) {
      case kPitch: {
        std::transform(
            f0.begin(), f0.end(), f0.begin(), [sampling_rate_in_hz](double x) {
              return (0.0 == x) ? kDefaultF0 : sampling_rate_in_hz / x;
            });
        break;
      }
      case kF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [](double x) { return (0.0 == x) ? kDefaultF0 : x; });
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? kDefaultF0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<double> waveform;
  {
    std::ifstream ifs;
    if (NULL != raw_file) {
      ifs.open(raw_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << raw_file;
        sptk::PrintErrorMessage("ap", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  sptk::AperiodicityExtraction aperiodicity_extraction(
      fft_length, frame_shift, sampling_rate_in_hz, algorithm);
  if (!aperiodicity_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize AperiodicityExtraction";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  std::vector<std::vector<double> > aperiodicity;
  if (!aperiodicity_extraction.Run(waveform, f0, &aperiodicity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract aperiodicity";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  const int output_length(fft_length / 2 + 1);
  std::vector<double> output(output_length);

  for (const std::vector<double>& tmp : aperiodicity) {
    std::transform(tmp.begin(), tmp.end(), output.begin(),
                   [lower_bound, upper_bound](double a) {
                     return std::min(upper_bound, std::max(lower_bound, a));
                   });

    switch (output_format) {
      case kAperiodicity: {
        // nothing to do
        break;
      }
      case kPeriodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return 1.0 - a; });
        break;
      }
      case kAperiodicityOverPeriodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return a / (1.0 - a); });
        break;
      }
      case kPeriodicityOverAperiodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return (1.0 - a) / a; });
        break;
      }
      default: {
        break;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write aperiodicity";
      sptk::PrintErrorMessage("ap", error_message);
      return 1;
    }
  }

  return 0;
}